

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

Message __thiscall
testing::internal::ElementsAreMatcherImpl<const_std::vector<int,_std::allocator<int>_>_&>::Elements
          (ElementsAreMatcherImpl<const_std::vector<int,_std::allocator<int>_>_&> *this,size_t count
          )

{
  Message *msg;
  pointer *__ptr;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  char *local_20;
  
  Message::Message((Message *)&local_28);
  std::ostream::_M_insert<unsigned_long>((ulong)(local_28._M_head_impl + 0x10));
  local_20 = " elements";
  if (count == 1) {
    local_20 = " element";
  }
  msg = Message::operator<<((Message *)&local_28,&local_20);
  Message::Message((Message *)this,msg);
  if (local_28._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_28._M_head_impl + 8))();
  }
  return (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )this;
}

Assistant:

static Message Elements(size_t count) {
    return Message() << count << (count == 1 ? " element" : " elements");
  }